

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1FwdTxfm2d_RunFwdAccuracyCheck_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::AV1FwdTxfm2d_RunFwdAccuracyCheck_Test>
           *this)

{
  TestWithParam<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> *this_00;
  
  WithParamInterface<std::tuple<unsigned_char,unsigned_char,double,double>>::parameter_ =
       &this->parameter_;
  this_00 = (TestWithParam<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> *)
            operator_new(0x78);
  TestWithParam<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::TestWithParam(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__TestWithParam_00f3eff0;
  (this_00->super_WithParamInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>).
  _vptr_WithParamInterface = (_func_int **)&DAT_00f3f030;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }